

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

int dump_schema_index(tnt_schema_sval *sval)

{
  assoc_val **ppaVar1;
  uint local_34;
  mh_int_t n;
  tnt_schema_ival *ival;
  uint local_18;
  uint local_14;
  mh_int_t i;
  mh_int_t ipos;
  tnt_schema_sval *sval_local;
  
  local_18 = 0;
  while ((local_18 < sval->index->n_buckets &&
         ((sval->index->b[local_18 >> 4] & 1 << ((byte)local_18 & 0xf)) == 0))) {
    local_18 = local_18 + 1;
  }
  local_14 = local_18;
  do {
    if (sval->index->n_buckets <= local_14) {
      return 0;
    }
    ppaVar1 = mh_assoc_node(sval->index,local_14);
    printf("    %d: %s\n",(ulong)*(uint *)((long)(*ppaVar1)->data + 0xc),*(*ppaVar1)->data);
    local_34 = local_14;
    if (local_14 < sval->index->n_buckets) {
      do {
        local_34 = local_14 + 1;
        if (sval->index->n_buckets <= local_34) break;
        local_14 = local_34;
      } while ((sval->index->b[local_34 >> 4] & 1 << ((byte)local_34 & 0xf)) == 0);
    }
    local_14 = local_34;
  } while( true );
}

Assistant:

int dump_schema_index(struct tnt_schema_sval *sval) {
	mh_int_t ipos = 0;
	mh_foreach(sval->index, ipos) {
		struct tnt_schema_ival *ival = NULL;
		ival = (*mh_assoc_node(sval->index, ipos))->data;
		printf("    %d: %s\n", ival->number, ival->name);
	}
	return 0;
}